

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfoDebug.cpp
# Opt level: O0

HighsDebugStatus debugNoInfo(HighsInfo *info)

{
  _func_int *p_Var1;
  HighsInfoType HVar2;
  uint uVar3;
  _func_int *p_Var4;
  bool bVar5;
  bool bVar6;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *this;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *this_00;
  size_type sVar7;
  const_reference ppIVar8;
  long in_RDI;
  double v1_2;
  double v0_2;
  int v1_1;
  int v0_1;
  int v1;
  int v0;
  HighsInfoType type;
  HighsInt index;
  HighsInt num_info;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *no_info_records;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records;
  bool error_found;
  HighsInfo no_info;
  HighsInfo *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  int iVar9;
  undefined4 in_stack_fffffffffffffec4;
  uint local_f0;
  HighsInfo local_c8;
  long local_10;
  HighsDebugStatus local_4;
  
  local_10 = in_RDI;
  HighsInfo::HighsInfo((HighsInfo *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  HighsInfo::invalidate(&local_c8);
  bVar6 = false;
  this = (vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *)(local_10 + 0xa0);
  this_00 = &local_c8.records;
  sVar7 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::size(this);
  for (local_f0 = 0; (int)local_f0 < (int)sVar7; local_f0 = local_f0 + 1) {
    ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                        (this,(long)(int)local_f0);
    HVar2 = (*ppIVar8)->type;
    if (HVar2 == kInt64) {
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      p_Var4 = *(*ppIVar8)[1]._vptr_InfoRecord;
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      if ((int)p_Var4 != (int)*(*ppIVar8)[1]._vptr_InfoRecord) {
        printf("debugNoInfo: Index %d has %d != %d \n",(ulong)local_f0,(ulong)p_Var4 & 0xffffffff,
               (ulong)*(*ppIVar8)[1]._vptr_InfoRecord & 0xffffffff);
      }
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      p_Var4 = *(*ppIVar8)[1]._vptr_InfoRecord;
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this_00,(long)(int)local_f0);
      bVar5 = true;
      if (p_Var4 == *(*ppIVar8)[1]._vptr_InfoRecord) {
        bVar5 = bVar6;
      }
    }
    else if (HVar2 == kInt) {
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      uVar3 = *(uint *)(*ppIVar8)[1]._vptr_InfoRecord;
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      if (uVar3 != *(uint *)(*ppIVar8)[1]._vptr_InfoRecord) {
        printf("debugNoInfo: Index %d has %d != %d \n",(ulong)local_f0,(ulong)uVar3,
               (ulong)*(uint *)(*ppIVar8)[1]._vptr_InfoRecord);
      }
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this,(long)(int)local_f0);
      iVar9 = *(int *)(*ppIVar8)[1]._vptr_InfoRecord;
      ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                          (this_00,(long)(int)local_f0);
      bVar5 = true;
      if (iVar9 == *(int *)(*ppIVar8)[1]._vptr_InfoRecord) {
        bVar5 = bVar6;
      }
    }
    else {
      bVar5 = bVar6;
      if (HVar2 == kDouble) {
        ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                            (this,(long)(int)local_f0);
        p_Var4 = *(*ppIVar8)[1]._vptr_InfoRecord;
        ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                            (this,(long)(int)local_f0);
        p_Var1 = *(*ppIVar8)[1]._vptr_InfoRecord;
        if (((double)p_Var4 != (double)p_Var1) || (NAN((double)p_Var4) || NAN((double)p_Var1))) {
          printf("debugNoInfo: Index %d has %g != %g \n",p_Var4,p_Var1,(ulong)local_f0);
        }
        ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                            (this,(long)(int)local_f0);
        in_stack_fffffffffffffeb0 = (HighsInfo *)*(*ppIVar8)[1]._vptr_InfoRecord;
        ppIVar8 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[]
                            (this_00,(long)(int)local_f0);
        bVar5 = true;
        if (((double)in_stack_fffffffffffffeb0 == (double)*(*ppIVar8)[1]._vptr_InfoRecord) &&
           (!NAN((double)in_stack_fffffffffffffeb0) && !NAN((double)*(*ppIVar8)[1]._vptr_InfoRecord)
           )) {
          bVar5 = bVar6;
        }
      }
    }
    bVar6 = bVar5;
  }
  bVar5 = true;
  if ((*(byte *)(local_10 + 8) & 1) == (local_c8.super_HighsInfoStruct.valid & 1U)) {
    bVar5 = bVar6;
  }
  if (bVar5) {
    local_4 = kLogicalError;
  }
  else {
    local_4 = kOk;
  }
  HighsInfo::~HighsInfo(in_stack_fffffffffffffeb0);
  return local_4;
}

Assistant:

HighsDebugStatus debugNoInfo(const HighsInfo& info) {
  HighsInfo no_info;
  no_info.invalidate();
  bool error_found = false;
  const std::vector<InfoRecord*>& info_records = info.records;
  const std::vector<InfoRecord*>& no_info_records = no_info.records;
  HighsInt num_info = info_records.size();
  for (HighsInt index = 0; index < num_info; index++) {
    HighsInfoType type = info_records[index]->type;
    if (type == HighsInfoType::kInt64) {
      int v0 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt64*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt64*)info_records[index])[0].value) !=
                     *(((InfoRecordInt64*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kInt) {
      int v0 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      int v1 = (int)*(((InfoRecordInt*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %d != %d \n", index,
               v0, v1);
      error_found = (*(((InfoRecordInt*)info_records[index])[0].value) !=
                     *(((InfoRecordInt*)no_info_records[index])[0].value)) ||
                    error_found;
    } else if (type == HighsInfoType::kDouble) {
      double v0 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      double v1 = (double)*(((InfoRecordDouble*)info_records[index])[0].value);
      if (v0 != v1)
        printf("debugNoInfo: Index %" HIGHSINT_FORMAT " has %g != %g \n", index,
               v0, v1);
      error_found = (*(((InfoRecordDouble*)info_records[index])[0].value) !=
                     *(((InfoRecordDouble*)no_info_records[index])[0].value)) ||
                    error_found;
    } else {
      assert(1 == 0);
    }
  }
  error_found = (info.valid != no_info.valid) || error_found;
  if (error_found) return HighsDebugStatus::kLogicalError;
  return HighsDebugStatus::kOk;
}